

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *os,float2 *v)

{
  ostream *poVar1;
  char *this;
  _anonymous_namespace_ *this_00;
  string local_60;
  string local_40;
  
  this = "(";
  poVar1 = std::operator<<(os,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)this,v->_M_elems[0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  this_00 = (_anonymous_namespace_ *)0x31f5a4;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_60,this_00,v->_M_elems[1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::operator<<(poVar1,")");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::float2 &v) {
  os << "(" << tinyusdz::dtos(v[0]) << ", " << tinyusdz::dtos(v[1]) << ")";
  return os;
}